

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void __thiscall ncnn::UnlockedPoolAllocator::UnlockedPoolAllocator(UnlockedPoolAllocator *this)

{
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_> *plVar1
  ;
  _List_node_base *p_Var2;
  UnlockedPoolAllocatorPrivate *in_RDI;
  
  *(_func_int ***)in_RDI = (_func_int **)0x0;
  Allocator::Allocator((Allocator *)in_RDI);
  *(undefined ***)in_RDI = &PTR__UnlockedPoolAllocator_01fa8938;
  plVar1 = &in_RDI->budgets;
  p_Var2 = (_List_node_base *)operator_new(0x38);
  UnlockedPoolAllocatorPrivate::UnlockedPoolAllocatorPrivate(in_RDI);
  (plVar1->
  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = p_Var2;
  *(undefined4 *)
   &((in_RDI->budgets).
     super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
     ._M_impl._M_node.super__List_node_base._M_next)->_M_next = 0xc0;
  return;
}

Assistant:

UnlockedPoolAllocator::UnlockedPoolAllocator()
    : Allocator(), d(new UnlockedPoolAllocatorPrivate)
{
    d->size_compare_ratio = 192; // 0.75f * 256
}